

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbest_generator.cpp
# Opt level: O3

bool __thiscall MeCab::NBestGenerator::set(NBestGenerator *this,Lattice *lattice)

{
  int iVar1;
  QueueElement *pQVar2;
  undefined4 extraout_var;
  QueueElement *eos;
  QueueElement *local_28;
  
  (this->freelist_).pi_ = 0;
  (this->freelist_).li_ = 0;
  if ((this->agenda_).c.
      super__Vector_base<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->agenda_).c.
      super__Vector_base<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      std::
      priority_queue<MeCab::NBestGenerator::QueueElement_*,_std::vector<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>,_MeCab::NBestGenerator::QueueElementComp>
      ::pop(&this->agenda_);
    } while ((this->agenda_).c.
             super__Vector_base<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             (this->agenda_).c.
             super__Vector_base<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  pQVar2 = FreeList<MeCab::NBestGenerator::QueueElement>::alloc(&this->freelist_);
  local_28 = pQVar2;
  iVar1 = (*lattice->_vptr_Lattice[3])(lattice);
  pQVar2->node = (Node *)CONCAT44(extraout_var,iVar1);
  pQVar2->next = (QueueElement *)0x0;
  pQVar2->fx = 0;
  pQVar2->gx = 0;
  std::
  priority_queue<MeCab::NBestGenerator::QueueElement_*,_std::vector<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>,_MeCab::NBestGenerator::QueueElementComp>
  ::push(&this->agenda_,&local_28);
  return true;
}

Assistant:

bool NBestGenerator::set(Lattice *lattice) {
  freelist_.free();
  while (!agenda_.empty()) {
    agenda_.pop();   // make empty
  }
  QueueElement *eos = freelist_.alloc();
  eos->node = lattice->eos_node();
  eos->next = 0;
  eos->fx = eos->gx = 0;
  agenda_.push(eos);
  return true;
}